

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

Ssw_Sml_t * Ssw_SmlStart(Aig_Man_t *pAig,int nPref,int nFrames,int nWordsFrame)

{
  Ssw_Sml_t *__s;
  int iVar1;
  
  iVar1 = nFrames + nPref;
  __s = (Ssw_Sml_t *)malloc((long)iVar1 * (long)nWordsFrame * 4 * (long)pAig->vObjs->nSize + 0x30);
  memset(__s,0,(long)iVar1 * (long)nWordsFrame * 4 + 0x30);
  __s->pAig = pAig;
  __s->nPref = nPref;
  __s->nFrames = iVar1;
  __s->nWordsFrame = nWordsFrame;
  __s->nWordsTotal = iVar1 * nWordsFrame;
  __s->nWordsPref = nWordsFrame * nPref;
  return __s;
}

Assistant:

Ssw_Sml_t * Ssw_SmlStart( Aig_Man_t * pAig, int nPref, int nFrames, int nWordsFrame )
{
    Ssw_Sml_t * p;
    p = (Ssw_Sml_t *)ABC_ALLOC( char, sizeof(Ssw_Sml_t) + sizeof(unsigned) * Aig_ManObjNumMax(pAig) * (nPref + nFrames) * nWordsFrame );
    memset( p, 0, sizeof(Ssw_Sml_t) + sizeof(unsigned) * (nPref + nFrames) * nWordsFrame );
    p->pAig        = pAig;
    p->nPref       = nPref;
    p->nFrames     = nPref + nFrames;
    p->nWordsFrame = nWordsFrame;
    p->nWordsTotal = (nPref + nFrames) * nWordsFrame;
    p->nWordsPref  = nPref * nWordsFrame;
    return p;
}